

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gls::MultiVertexArrayTest::iterate(MultiVertexArrayTest *this)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  ostringstream *this_00;
  Primitive PVar3;
  InputType type;
  uint uVar4;
  int componentCount;
  int offset;
  int stride;
  TestLog *pTVar5;
  ContextArrayPack *pCVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  GLValue min;
  GLValue min_00;
  GLValue max;
  GLValue max_00;
  char cVar13;
  bool bVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  pointer pAVar20;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar21;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  int iVar22;
  int iVar23;
  byte bVar24;
  qpTestResult testResult;
  int seed;
  TestContext *this_01;
  long lVar25;
  ulong uVar26;
  long lVar27;
  int iVar28;
  float fVar29;
  float fVar30;
  ArraySpec arraySpec;
  float local_264;
  string local_208;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_1c0;
  undefined1 local_1b8 [48];
  GLValue local_188 [4];
  ios_base local_140 [272];
  
  if (this->m_iteration == 1) {
    VertexArrayTest::compare(&this->super_VertexArrayTest);
    if ((this->super_VertexArrayTest).m_isOk == true) {
      this_01 = (this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx;
      pcVar21 = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      bVar14 = isUnalignedBufferOffsetTest(this);
      if (bVar14) {
        this_01 = (this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx;
        pcVar21 = "Failed to draw with unaligned buffers.";
      }
      else {
        bVar14 = isUnalignedBufferStrideTest(this);
        this_01 = (this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx;
        if (!bVar14) {
          pcVar21 = "Image comparison failed.";
          testResult = QP_TEST_RESULT_FAIL;
          goto LAB_004a5021;
        }
        pcVar21 = "Failed to draw with unaligned stride.";
      }
      testResult = QP_TEST_RESULT_COMPATIBILITY_WARNING;
    }
LAB_004a5021:
    tcu::TestContext::setTestResult(this_01,testResult,pcVar21);
    this->m_iteration = this->m_iteration + 1;
    return STOP;
  }
  if (this->m_iteration != 0) {
    return STOP;
  }
  PVar3 = (this->m_spec).primitive;
  uVar15 = (*((this->super_VertexArrayTest).m_renderCtx)->_vptr_RenderContext[2])();
  pTVar5 = ((this->super_VertexArrayTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b8 + 8);
  local_1b8._0_4_ = SUB84(pTVar5,0);
  local_1b8._4_4_ = (undefined4)((ulong)pTVar5 >> 0x20);
  std::__cxx11::ostringstream::ostringstream(this_00);
  Spec::getDesc_abi_cxx11_(&local_208,&this->m_spec);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_208._M_dataplus._M_p,local_208._M_string_length);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_140);
  pAVar20 = (this->m_spec).arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = pAVar20->inputType;
  uVar9 = pAVar20->outputType;
  uVar10._0_4_ = pAVar20->storage;
  uVar10._4_4_ = pAVar20->usage;
  uVar11._0_4_ = pAVar20->componentCount;
  uVar11._4_4_ = pAVar20->offset;
  local_1b8._24_4_ = pAVar20->stride;
  local_1b8[0x1c] = pAVar20->normalize;
  local_1b8._29_3_ = *(undefined3 *)&pAVar20->field_0x1d;
  local_1b8._32_4_ = (pAVar20->min).type;
  local_1b8._36_4_ = *(undefined4 *)&(pAVar20->min).field_0x4;
  local_1b8._40_8_ = (pAVar20->min).field_1;
  local_188[0].type = (pAVar20->max).type;
  local_188[0]._4_4_ = *(undefined4 *)&(pAVar20->max).field_0x4;
  local_188[0].field_1 = (pAVar20->max).field_1;
  local_1b8._8_3_ = (undefined3)(undefined4)uVar10;
  local_1b8._11_4_ = (undefined4)((ulong)uVar10 >> 0x18);
  local_1b8[0xf] = (undefined1)((uint)uVar10._4_4_ >> 0x18);
  local_1b8._16_3_ = (undefined3)(undefined4)uVar11;
  local_1b8._19_5_ = (undefined5)((ulong)uVar11 >> 0x18);
  local_1b8._0_4_ = uVar8;
  local_1b8._4_4_ = uVar9;
  if (uVar8 == 0xb) {
    if (local_1b8[0x1c] == '\0') {
      fVar29 = 0.001953125;
      goto LAB_004a4a72;
    }
  }
  else {
    if (uVar8 != 10) {
      if ((local_1b8[0x1c] == '\0') ||
         ((fVar29 = 1.0, (uint)uVar8 < 10 && ((0x207U >> (uVar8 & 0x1f) & 1) != 0)))) {
        fVar29 = GLValue::toFloat((GLValue *)(local_1b8 + 0x30));
        fVar29 = 0.9 / fVar29;
      }
      goto LAB_004a4a72;
    }
    if (local_1b8[0x1c] == '\0') {
      fVar29 = 0.0009765625;
      goto LAB_004a4a72;
    }
  }
  fVar29 = 1.0;
LAB_004a4a72:
  if (((uint)local_1b8._4_4_ < 0xc) && ((0xd8cU >> (local_1b8._4_4_ & 0x1f) & 1) != 0)) {
    fVar29 = fVar29 * 0.5;
  }
  pAVar20 = (this->m_spec).arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar22 = (int)((ulong)((long)(this->m_spec).arrays.
                               super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar20) >> 6);
  if (iVar22 < 2) {
    local_264 = 1.0;
  }
  else {
    local_264 = 1.0;
    lVar27 = 1;
    lVar25 = 0x40;
    do {
      puVar1 = (undefined8 *)((long)&pAVar20->inputType + lVar25);
      uVar10 = *puVar1;
      uVar11 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pAVar20->componentCount + lVar25);
      uVar12 = *puVar1;
      local_1b8._24_8_ = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pAVar20->min).type + lVar25);
      local_1b8._32_8_ = *puVar1;
      local_1b8._40_8_ = *(anon_union_8_10_1f5805e9_for_GLValue_1 *)(puVar1 + 1);
      puVar1 = (undefined8 *)((long)&(pAVar20->max).type + lVar25);
      local_188[0]._0_8_ = *puVar1;
      local_188[0].field_1 = *(anon_union_8_10_1f5805e9_for_GLValue_1 *)(puVar1 + 1);
      local_1b8._16_3_ = (undefined3)uVar12;
      local_1b8._19_5_ = (undefined5)((ulong)uVar12 >> 0x18);
      local_1b8._0_4_ = (undefined4)uVar10;
      local_1b8._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
      local_1b8._8_3_ = (undefined3)uVar11;
      local_1b8._11_4_ = (undefined4)((ulong)uVar11 >> 0x18);
      local_1b8[0xf] = (undefined1)((ulong)uVar11 >> 0x38);
      cVar13 = local_1b8[0x1c];
      if ((local_1b8[0x1c] == '\x01') &&
         ((9 < (uint)local_1b8._0_4_ || ((0x207U >> (local_1b8._0_4_ & 0x1f) & 1) == 0)))) {
        if (local_1b8._4_4_ == 3) {
LAB_004a4b75:
          if ((uint)local_1b8._0_4_ < 10) {
            fVar30 = 1.0;
            if ((0x207U >> (local_1b8._0_4_ & 0x1f) & 1) != 0) goto LAB_004a4b87;
          }
          else {
            fVar30 = 1.0;
          }
LAB_004a4ba7:
          local_264 = local_264 * fVar30;
        }
      }
      else {
        fVar30 = GLValue::toFloat((GLValue *)(local_1b8 + 0x30));
        local_264 = local_264 * (1.0 / fVar30);
        if (local_1b8._4_4_ == 3) {
          if (cVar13 != '\0') goto LAB_004a4b75;
LAB_004a4b87:
          fVar30 = GLValue::toFloat((GLValue *)(local_1b8 + 0x30));
          fVar30 = 1.0 / fVar30;
          goto LAB_004a4ba7;
        }
      }
      lVar27 = lVar27 + 1;
      pAVar20 = (this->m_spec).arrays.
                super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar22 = (int)((ulong)((long)(this->m_spec).arrays.
                                   super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar20) >> 6)
      ;
      lVar25 = lVar25 + 0x40;
    } while (lVar27 < iVar22);
  }
  iVar23 = (uint)(PVar3 == PRIMITIVE_TRIANGLES) * 5 + 1;
  if (0 < iVar22) {
    lVar25 = 0;
    uVar26 = 0;
    do {
      type = *(InputType *)((long)&pAVar20->inputType + lVar25);
      iVar22 = *(int *)((long)&pAVar20->outputType + lVar25);
      uVar4 = *(uint *)((long)&pAVar20->storage + lVar25);
      iVar19 = *(int *)((long)&pAVar20->usage + lVar25);
      componentCount = *(int *)((long)&pAVar20->componentCount + lVar25);
      offset = *(int *)((long)&pAVar20->offset + lVar25);
      stride = *(int *)((long)&pAVar20->stride + lVar25);
      bVar14 = (&pAVar20->normalize)[lVar25];
      uVar10 = *(undefined8 *)(&pAVar20->field_0x1d + lVar25);
      uVar11 = *(undefined8 *)((long)(&pAVar20->field_0x1d + lVar25) + 8);
      local_1b8._0_4_ = (undefined4)uVar10;
      local_1b8._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
      local_1b8._8_3_ = (undefined3)uVar11;
      local_1b8._11_4_ = (undefined4)((ulong)uVar11 >> 0x18);
      local_1b8._16_3_ =
           (undefined3)((uint)*(undefined4 *)((long)&(pAVar20->min).field_1 + lVar25 + 4) >> 8);
      local_1b8[0xf] = (undefined1)((ulong)uVar11 >> 0x38);
      puVar2 = (undefined4 *)((long)&(pAVar20->max).type + lVar25);
      local_1e8 = *puVar2;
      uStack_1e4 = puVar2[1];
      uStack_1e0 = puVar2[2];
      uStack_1dc = puVar2[3];
      PVar3 = (this->m_spec).primitive;
      iVar18 = (this->m_spec).drawCount;
      iVar28 = Array::inputTypeSize::size[(int)type];
      iVar7 = stride;
      if (stride == 0) {
        iVar7 = iVar28 * componentCount;
      }
      iVar16 = (*((this->super_VertexArrayTest).m_renderCtx)->_vptr_RenderContext[4])();
      iVar16 = *(int *)CONCAT44(extraout_var,iVar16);
      iVar17 = (*((this->super_VertexArrayTest).m_renderCtx)->_vptr_RenderContext[4])();
      iVar17 = *(int *)(CONCAT44(extraout_var_00,iVar17) + 4);
      if (iVar16 < iVar17) {
        iVar17 = iVar16;
      }
      if ((this->m_spec).primitive == PRIMITIVE_TRIANGLES) {
        seed = (bVar14 & 1) + stride + PVar3 * 1000 + iVar18 +
               iVar19 * 10000 + uVar4 * 100 + type + iVar22 * 10 + componentCount * 0xc;
        iVar16 = (this->m_spec).drawCount;
        if (uVar26 == 0) {
          local_1c8 = CONCAT35(local_1b8._8_3_,CONCAT41(local_1b8._4_4_,local_1b8[3]));
          aStack_1c0._4_4_ = local_1b8._15_4_;
          aStack_1c0.fl.m_value = (Float)(Float)local_1b8._11_4_;
          max_00._4_4_ = uStack_1e4;
          max_00.type = local_1e8;
          max_00.field_1._4_4_ = uStack_1dc;
          max_00.field_1.fl.m_value = (Float)(Float)uStack_1e0;
          min_00._4_4_ = (int)((ulong)local_1c8 >> 0x20);
          min_00.type = (int)CONCAT41(local_1b8._4_4_,local_1b8[3]);
          min_00.field_1 = aStack_1c0;
          pcVar21 = RandomArrayGenerator::generateQuads
                              (seed,iVar16,componentCount,offset,stride,PRIMITIVE_TRIANGLES,type,
                               min_00,max_00,3.0 / (float)(iVar17 + -1));
        }
        else {
          local_1d8 = CONCAT35(local_1b8._8_3_,CONCAT41(local_1b8._4_4_,local_1b8[3]));
          uStack_1d0 = CONCAT44(local_1b8._15_4_,local_1b8._11_4_);
          max._4_4_ = uStack_1e4;
          max.type = local_1e8;
          max.field_1._4_4_ = uStack_1dc;
          max.field_1.fl.m_value = (Float)(Float)uStack_1e0;
          min._4_4_ = (int)((ulong)local_1d8 >> 0x20);
          min.type = (int)CONCAT41(local_1b8._4_4_,local_1b8[3]);
          min.field_1.fl.m_value = (Float)(Float)local_1b8._11_4_;
          min.field_1._4_4_ = local_1b8._15_4_;
          pcVar21 = RandomArrayGenerator::generatePerQuad
                              (seed,iVar16,componentCount,stride,PRIMITIVE_TRIANGLES,type,min,max);
        }
      }
      else {
        pcVar21 = (char *)0x0;
      }
      iVar28 = iVar28 * componentCount + offset + iVar7 * (iVar18 * iVar23 + -1);
      pCVar6 = (this->super_VertexArrayTest).m_glArrayPack;
      (*pCVar6->_vptr_ContextArrayPack[4])(pCVar6,(ulong)uVar4);
      pCVar6 = (this->super_VertexArrayTest).m_rrArrayPack;
      (*pCVar6->_vptr_ContextArrayPack[4])(pCVar6,(ulong)uVar4);
      pCVar6 = (this->super_VertexArrayTest).m_glArrayPack;
      iVar18 = (*pCVar6->_vptr_ContextArrayPack[2])(pCVar6,uVar26 & 0xffffffff);
      (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar18) + 0x10))
                ((long *)CONCAT44(extraout_var_01,iVar18),1,iVar28,pcVar21,iVar19);
      pCVar6 = (this->super_VertexArrayTest).m_rrArrayPack;
      iVar18 = (*pCVar6->_vptr_ContextArrayPack[2])(pCVar6,uVar26 & 0xffffffff);
      (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar18) + 0x10))
                ((long *)CONCAT44(extraout_var_02,iVar18),1,iVar28,pcVar21,iVar19);
      pCVar6 = (this->super_VertexArrayTest).m_glArrayPack;
      iVar19 = (*pCVar6->_vptr_ContextArrayPack[2])(pCVar6,uVar26 & 0xffffffff);
      bVar24 = bVar14 & 1;
      (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar19) + 0x20))
                ((long *)CONCAT44(extraout_var_03,iVar19),uVar26 & 0xffffffff,offset,componentCount,
                 type,iVar22,bVar24,stride);
      pCVar6 = (this->super_VertexArrayTest).m_rrArrayPack;
      iVar19 = (*pCVar6->_vptr_ContextArrayPack[2])(pCVar6,uVar26 & 0xffffffff);
      (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar19) + 0x20))
                ((long *)CONCAT44(extraout_var_04,iVar19),uVar26 & 0xffffffff,offset,componentCount,
                 type,iVar22,bVar24,stride);
      if (pcVar21 != (char *)0x0) {
        operator_delete__(pcVar21);
      }
      uVar26 = uVar26 + 1;
      pAVar20 = (this->m_spec).arrays.
                super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar25 = lVar25 + 0x40;
    } while ((long)uVar26 <
             (long)(int)((ulong)((long)(this->m_spec).arrays.
                                       super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar20)
                        >> 6));
  }
  pCVar6 = (this->super_VertexArrayTest).m_glArrayPack;
  (*pCVar6->_vptr_ContextArrayPack[5])
            (fVar29,local_264,pCVar6,(ulong)(this->m_spec).primitive,
             (ulong)(uint)(this->m_spec).first,(ulong)(uint)((this->m_spec).drawCount * iVar23),
             (ulong)((uVar15 & 0x300) == 0x100));
  pCVar6 = (this->super_VertexArrayTest).m_rrArrayPack;
  (*pCVar6->_vptr_ContextArrayPack[5])
            (fVar29,local_264,pCVar6,(ulong)(this->m_spec).primitive,
             (ulong)(uint)(this->m_spec).first,(ulong)(uint)(iVar23 * (this->m_spec).drawCount),
             (ulong)((uVar15 & 0x300) == 0x100));
  this->m_iteration = this->m_iteration + 1;
  return CONTINUE;
}

Assistant:

MultiVertexArrayTest::IterateResult MultiVertexArrayTest::iterate (void)
{
	if (m_iteration == 0)
	{
		const size_t	primitiveSize		= (m_spec.primitive == Array::PRIMITIVE_TRIANGLES) ? (6) : (1); // in non-indexed draw Triangles means rectangles
		float			coordScale			= 1.0f;
		float			colorScale			= 1.0f;
		const bool		useVao				= m_renderCtx.getType().getProfile() == glu::PROFILE_CORE;

		// Log info
		m_testCtx.getLog() << TestLog::Message << m_spec.getDesc() << TestLog::EndMessage;

		// Color and Coord scale
		{
			// First array is always position
			{
				Spec::ArraySpec arraySpec = m_spec.arrays[0];
				if (arraySpec.inputType == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10)
				{
					if (arraySpec.normalize)
						coordScale = 1.0f;
					else
						coordScale = 1.0 / 1024.0;
				}
				else if (arraySpec.inputType == Array::INPUTTYPE_INT_2_10_10_10)
				{
					if (arraySpec.normalize)
						coordScale = 1.0f;
					else
						coordScale = 1.0 / 512.0;
				}
				else
					coordScale = (arraySpec.normalize && !inputTypeIsFloatType(arraySpec.inputType) ? 1.0f : float(0.9 / double(arraySpec.max.toFloat())));

				if (arraySpec.outputType == Array::OUTPUTTYPE_VEC3 || arraySpec.outputType == Array::OUTPUTTYPE_VEC4
					|| arraySpec.outputType == Array::OUTPUTTYPE_IVEC3 || arraySpec.outputType == Array::OUTPUTTYPE_IVEC4
					|| arraySpec.outputType == Array::OUTPUTTYPE_UVEC3 || arraySpec.outputType == Array::OUTPUTTYPE_UVEC4)
						coordScale = coordScale * 0.5f;
			}

			// And other arrays are color-like
			for (int arrayNdx = 1; arrayNdx < (int)m_spec.arrays.size(); arrayNdx++)
			{
				Spec::ArraySpec arraySpec	= m_spec.arrays[arrayNdx];

				colorScale *= (arraySpec.normalize && !inputTypeIsFloatType(arraySpec.inputType) ? 1.0f : float(1.0 / double(arraySpec.max.toFloat())));
				if (arraySpec.outputType == Array::OUTPUTTYPE_VEC4)
					colorScale *= (arraySpec.normalize && !inputTypeIsFloatType(arraySpec.inputType) ? 1.0f : float(1.0 / double(arraySpec.max.toFloat())));
			}
		}

		// Data
		for (int arrayNdx = 0; arrayNdx < (int)m_spec.arrays.size(); arrayNdx++)
		{
			Spec::ArraySpec arraySpec		= m_spec.arrays[arrayNdx];
			const int		seed			= int(arraySpec.inputType) + 10 * int(arraySpec.outputType) + 100 * int(arraySpec.storage) + 1000 * int(m_spec.primitive) + 10000 * int(arraySpec.usage) + int(m_spec.drawCount) + 12 * int(arraySpec.componentCount) + int(arraySpec.stride) + int(arraySpec.normalize);
			const char*		data			= DE_NULL;
			const size_t	stride			= (arraySpec.stride == 0) ? (arraySpec.componentCount * Array::inputTypeSize(arraySpec.inputType)) : (arraySpec.stride);
			const size_t	bufferSize		= arraySpec.offset + stride * (m_spec.drawCount * primitiveSize - 1) + arraySpec.componentCount  * Array::inputTypeSize(arraySpec.inputType);
			// Snap values to at least 3x3 grid
			const float		gridSize		= 3.0f / (float)(de::min(m_renderCtx.getRenderTarget().getWidth(), m_renderCtx.getRenderTarget().getHeight()) - 1);

			switch (m_spec.primitive)
			{
	//			case Array::PRIMITIVE_POINTS:
	//				data = RandomArrayGenerator::generateArray(seed, arraySpec.min, arraySpec.max, arraySpec.count, arraySpec.componentCount, arraySpec.stride, arraySpec.inputType);
	//				break;
				case Array::PRIMITIVE_TRIANGLES:
					if (arrayNdx == 0)
					{
						data = RandomArrayGenerator::generateQuads(seed, m_spec.drawCount, arraySpec.componentCount, arraySpec.offset, arraySpec.stride, m_spec.primitive, arraySpec.inputType, arraySpec.min, arraySpec.max, gridSize);
					}
					else
					{
						DE_ASSERT(arraySpec.offset == 0); // \note [jarkko] it just hasn't been implemented
						data = RandomArrayGenerator::generatePerQuad(seed, m_spec.drawCount, arraySpec.componentCount, arraySpec.stride, m_spec.primitive, arraySpec.inputType, arraySpec.min, arraySpec.max);
					}
					break;

				default:
					DE_ASSERT(false);
					break;
			}

			m_glArrayPack->newArray(arraySpec.storage);
			m_rrArrayPack->newArray(arraySpec.storage);

			m_glArrayPack->getArray(arrayNdx)->data(Array::TARGET_ARRAY, (int)bufferSize, data, arraySpec.usage);
			m_rrArrayPack->getArray(arrayNdx)->data(Array::TARGET_ARRAY, (int)bufferSize, data, arraySpec.usage);

			m_glArrayPack->getArray(arrayNdx)->bind(arrayNdx, arraySpec.offset, arraySpec.componentCount, arraySpec.inputType, arraySpec.outputType, arraySpec.normalize, arraySpec.stride);
			m_rrArrayPack->getArray(arrayNdx)->bind(arrayNdx, arraySpec.offset, arraySpec.componentCount, arraySpec.inputType, arraySpec.outputType, arraySpec.normalize, arraySpec.stride);

			delete [] data;
		}

		try
		{
			m_glArrayPack->render(m_spec.primitive, m_spec.first, m_spec.drawCount * (int)primitiveSize, useVao, coordScale, colorScale);
			m_rrArrayPack->render(m_spec.primitive, m_spec.first, m_spec.drawCount * (int)primitiveSize, useVao, coordScale, colorScale);
		}
		catch (glu::Error& err)
		{
			// GL Errors are ok if the mode is not properly aligned

			m_testCtx.getLog() << TestLog::Message << "Got error: " << err.what() << TestLog::EndMessage;

			if (isUnalignedBufferOffsetTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (isUnalignedBufferStrideTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				throw;

			return STOP;
		}

		m_iteration++;
		return CONTINUE;
	}
	else if (m_iteration == 1)
	{
		compare();

		if (m_isOk)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
		{
			if (isUnalignedBufferOffsetTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned buffers.");
			else if (isUnalignedBufferStrideTest())
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned stride.");
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed.");
		}

		m_iteration++;
		return STOP;
	}
	else
	{
		DE_ASSERT(false);
		return STOP;
	}
}